

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_dump.cpp
# Opt level: O2

XrResult ApiDumpLayerXrCreateApiLayerInstance
                   (XrInstanceCreateInfo *info,XrApiLayerCreateInfo *apiLayerInfo,
                   XrInstance *instance)

{
  XrApiLayerNextInfo *pXVar1;
  void *value;
  PFN_xrGetInstanceProcAddr get_inst_proc_addr;
  XrInstance instance_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  XrResult XVar5;
  ostream *poVar6;
  XrGeneratedDispatchTable *table;
  mapped_type *ppXVar7;
  invalid_argument *piVar8;
  ulong uVar9;
  long lVar10;
  size_type sVar11;
  XrInstanceCreateInfo *in_stack_fffffffffffff568;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  string info_prefix;
  string enabledextensionnames_prefix;
  string enabledextensioncount_prefix;
  string export_type;
  string prefix_1;
  string enabledapilayernames_prefix;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9a8;
  string enabledapilayercount_prefix;
  string applicationinfo_prefix;
  string flags_prefix;
  string next_prefix;
  string file_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  unique_lock<std::mutex> mlock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  XrInstance returned_instance;
  ostringstream oss_enabledExtensionNames_array;
  ostringstream oss_enabledExtensionCount;
  XrApiLayerCreateInfo local_250;
  
  memset(&local_250,0,0x220);
  bVar3 = g_record_info.initialized;
  if (g_record_info.initialized == false) {
    g_record_info.initialized = true;
    g_record_info.type = RECORD_TEXT_COUT;
  }
  PlatformUtilsGetEnv_abi_cxx11_(&export_type,"XR_API_DUMP_EXPORT_TYPE");
  PlatformUtilsGetEnv_abi_cxx11_(&file_name,"XR_API_DUMP_FILE_NAME");
  if (file_name._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&g_record_info.file_name);
    g_record_info.type = RECORD_TEXT_FILE;
  }
  if (export_type._M_string_length != 0) {
    std::__cxx11::string::string((string *)&mlock,(string *)&export_type);
    for (sVar11 = 0; export_type._M_string_length != sVar11; sVar11 = sVar11 + 1) {
      iVar4 = tolower((uint)(byte)export_type._M_dataplus._M_p[sVar11]);
      ((mlock._M_device)->super___mutex_base)._M_mutex.__size[sVar11] = (char)iVar4;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &mlock,"text");
    if (bVar2) {
      g_record_info.type = RECORD_TEXT_FILE - (g_record_info.file_name._M_string_length == 0);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &mlock,"html");
      if ((bVar3 == false) && (bVar2)) {
        g_record_info.type = RECORD_HTML_FILE;
        bVar3 = ApiDumpLayerWriteHtmlHeader();
        if (!bVar3) {
          std::__cxx11::string::~string((string *)&mlock);
          XVar5 = XR_ERROR_INITIALIZATION_FAILED;
          goto LAB_00104127;
        }
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&mlock,"code");
        if (bVar3) {
          g_record_info.type = RECORD_CODE_FILE;
        }
      }
    }
    std::__cxx11::string::~string((string *)&mlock);
  }
  XVar5 = XR_ERROR_INITIALIZATION_FAILED;
  if ((((((apiLayerInfo != (XrApiLayerCreateInfo *)0x0) &&
         (apiLayerInfo->structType == XR_LOADER_INTERFACE_STRUCT_API_LAYER_CREATE_INFO)) &&
        (apiLayerInfo->structVersion != 0)) &&
       ((0x21f < apiLayerInfo->structSize &&
        (pXVar1 = apiLayerInfo->nextInfo, pXVar1 != (XrApiLayerNextInfo *)0x0)))) &&
      ((pXVar1->structType == XR_LOADER_INTERFACE_STRUCT_API_LAYER_NEXT_INFO &&
       ((pXVar1->structVersion != 0 && (0x127 < pXVar1->structSize)))))) &&
     ((iVar4 = strcmp("XR_APILAYER_LUNARG_api_dump",pXVar1->layerName), iVar4 == 0 &&
      ((pXVar1->nextGetInstanceProcAddr != (PFN_xrGetInstanceProcAddr)0x0 &&
       (pXVar1->nextCreateApiLayerInstance != (PFN_xrCreateApiLayerInstance)0x0)))))) {
    contents.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    contents.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    contents.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[17],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [9])"XrResult",(char (*) [17])"xrCreateInstance",
               (char (*) [1])0x20fb54);
    PointerToHexString<XrInstanceCreateInfo>(in_stack_fffffffffffff568);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[28],char_const(&)[5],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [28])"const XrInstanceCreateInfo*",(char (*) [5])"info",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mlock);
    std::__cxx11::string::~string((string *)&mlock);
    if (info != (XrInstanceCreateInfo *)0x0) {
      std::__cxx11::string::string((string *)&info_prefix,"info->",(allocator *)&mlock);
      std::__cxx11::to_string((string *)&mlock,info->type);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[16],char_const(&)[11],std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)&contents,(char (*) [16])"XrStructureType",(char (*) [11])"info->type",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mlock);
      std::__cxx11::string::~string((string *)&mlock);
      std::__cxx11::string::string((string *)&next_prefix,(string *)&info_prefix);
      std::__cxx11::string::append((char *)&next_prefix);
      value = info->next;
      std::__cxx11::string::string((string *)&local_890,(string *)&next_prefix);
      bVar3 = ApiDumpDecodeNextChain((XrGeneratedDispatchTable *)0x0,value,&local_890,&contents);
      std::__cxx11::string::~string((string *)&local_890);
      if (!bVar3) {
        piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar8,"Invalid Operation");
        __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      std::__cxx11::string::string((string *)&flags_prefix,(string *)&info_prefix);
      std::__cxx11::string::append((char *)&flags_prefix);
      std::__cxx11::to_string((string *)&mlock,info->createFlags);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[22],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)&contents,(char (*) [22])"XrInstanceCreateFlags",&flags_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mlock);
      std::__cxx11::string::~string((string *)&mlock);
      std::__cxx11::string::string((string *)&applicationinfo_prefix,(string *)&info_prefix);
      std::__cxx11::string::append((char *)&applicationinfo_prefix);
      std::__cxx11::string::string((string *)&local_8b0,(string *)&applicationinfo_prefix);
      std::__cxx11::string::string((string *)&local_8d0,"XrApplicationInfo",(allocator *)&mlock);
      bVar3 = ApiDumpOutputXrStruct
                        ((XrGeneratedDispatchTable *)0x0,&info->applicationInfo,&local_8b0,
                         &local_8d0,true,&contents);
      std::__cxx11::string::~string((string *)&local_8d0);
      std::__cxx11::string::~string((string *)&local_8b0);
      if (!bVar3) {
        piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar8,"Invalid Operation");
        __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      std::__cxx11::string::string((string *)&enabledapilayercount_prefix,(string *)&info_prefix);
      std::__cxx11::string::append((char *)&enabledapilayercount_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&mlock);
      poVar6 = std::operator<<((ostream *)&mlock,"0x");
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)&contents,(char (*) [9])"uint32_t",&enabledapilayercount_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &returned_instance);
      std::__cxx11::string::~string((string *)&returned_instance);
      std::__cxx11::string::string((string *)&enabledapilayernames_prefix,(string *)&info_prefix);
      std::__cxx11::string::append((char *)&enabledapilayernames_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&returned_instance);
      poVar6 = std::operator<<((ostream *)&returned_instance,"0x");
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::_M_insert<void_const*>(poVar6);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[19],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)&contents,(char (*) [19])"const char* const*",&enabledapilayernames_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oss_enabledExtensionCount);
      std::__cxx11::string::~string((string *)&oss_enabledExtensionCount);
      lVar10 = 0;
      for (uVar9 = 0; uVar9 < info->enabledApiLayerCount; uVar9 = uVar9 + 1) {
        std::operator+(&enabledextensioncount_prefix,&enabledapilayernames_prefix,"[");
        std::__cxx11::to_string(&enabledextensionnames_prefix,(uint)uVar9);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &oss_enabledExtensionNames_array,&enabledextensioncount_prefix,
                       &enabledextensionnames_prefix);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &oss_enabledExtensionCount,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &oss_enabledExtensionNames_array,"]");
        std::__cxx11::string::~string((string *)&oss_enabledExtensionNames_array);
        std::__cxx11::string::~string((string *)&enabledextensionnames_prefix);
        std::__cxx11::string::~string((string *)&enabledextensioncount_prefix);
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[19],std::__cxx11::string&,char_const*const&>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                    *)&contents,(char (*) [19])"const char* const*",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &oss_enabledExtensionCount,(char **)((long)info->enabledApiLayerNames + lVar10));
        std::__cxx11::string::~string((string *)&oss_enabledExtensionCount);
        lVar10 = lVar10 + 8;
      }
      std::__cxx11::string::string((string *)&enabledextensioncount_prefix,(string *)&info_prefix);
      std::__cxx11::string::append((char *)&enabledextensioncount_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_enabledExtensionCount);
      poVar6 = std::operator<<((ostream *)&oss_enabledExtensionCount,"0x");
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)&contents,(char (*) [9])"uint32_t",&enabledextensioncount_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oss_enabledExtensionNames_array);
      std::__cxx11::string::~string((string *)&oss_enabledExtensionNames_array);
      std::__cxx11::string::string((string *)&enabledextensionnames_prefix,(string *)&info_prefix);
      std::__cxx11::string::append((char *)&enabledextensionnames_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_enabledExtensionNames_array);
      poVar6 = std::operator<<((ostream *)&oss_enabledExtensionNames_array,"0x");
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::_M_insert<void_const*>(poVar6);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[19],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)&contents,(char (*) [19])"const char* const*",&enabledextensionnames_prefix,
                 &prefix_1);
      std::__cxx11::string::~string((string *)&prefix_1);
      lVar10 = 0;
      for (uVar9 = 0; uVar9 < info->enabledExtensionCount; uVar9 = uVar9 + 1) {
        std::operator+(&local_8f0,&enabledextensionnames_prefix,"[");
        std::__cxx11::to_string(&local_870,(uint)uVar9);
        std::operator+(&local_6d8,&local_8f0,&local_870);
        std::operator+(&prefix_1,&local_6d8,"]");
        std::__cxx11::string::~string((string *)&local_6d8);
        std::__cxx11::string::~string((string *)&local_870);
        std::__cxx11::string::~string((string *)&local_8f0);
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[19],std::__cxx11::string&,char_const*const&>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                    *)&contents,(char (*) [19])"const char* const*",&prefix_1,
                   (char **)((long)info->enabledExtensionNames + lVar10));
        std::__cxx11::string::~string((string *)&prefix_1);
        lVar10 = lVar10 + 8;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_enabledExtensionNames_array)
      ;
      std::__cxx11::string::~string((string *)&enabledextensionnames_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_enabledExtensionCount);
      std::__cxx11::string::~string((string *)&enabledextensioncount_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&returned_instance);
      std::__cxx11::string::~string((string *)&enabledapilayernames_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&mlock);
      std::__cxx11::string::~string((string *)&enabledapilayercount_prefix);
      std::__cxx11::string::~string((string *)&applicationinfo_prefix);
      std::__cxx11::string::~string((string *)&flags_prefix);
      std::__cxx11::string::~string((string *)&next_prefix);
      std::__cxx11::string::~string((string *)&info_prefix);
    }
    PointerToHexString<XrInstance_T*>((XrInstance_T **)in_stack_fffffffffffff568);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[12],char_const(&)[9],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [12])"XrInstance*",(char (*) [9])"instance",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mlock);
    std::__cxx11::string::~string((string *)&mlock);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_9a8,&contents);
    ApiDumpLayerRecordContent(&local_9a8);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_9a8);
    memcpy(&local_250,apiLayerInfo,0x218);
    pXVar1 = apiLayerInfo->nextInfo;
    local_250.nextInfo = pXVar1->next;
    get_inst_proc_addr = pXVar1->nextGetInstanceProcAddr;
    returned_instance = *instance;
    XVar5 = (*pXVar1->nextCreateApiLayerInstance)(info,&local_250,&returned_instance);
    instance_00 = returned_instance;
    *instance = returned_instance;
    table = (XrGeneratedDispatchTable *)operator_new(0xa58);
    memset(table,0,0xa58);
    GeneratedXrPopulateDispatchTable(table,instance_00,get_inst_proc_addr);
    std::unique_lock<std::mutex>::unique_lock(&mlock,&g_instance_dispatch_mutex);
    ppXVar7 = std::__detail::
              _Map_base<XrInstance_T_*,_std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrInstance_T_*>,_std::hash<XrInstance_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<XrInstance_T_*,_std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrInstance_T_*>,_std::hash<XrInstance_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&g_instance_dispatch_map,&returned_instance);
    *ppXVar7 = table;
    std::unique_lock<std::mutex>::~unique_lock(&mlock);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&contents);
  }
LAB_00104127:
  std::__cxx11::string::~string((string *)&file_name);
  std::__cxx11::string::~string((string *)&export_type);
  return XVar5;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrCreateApiLayerInstance(const XrInstanceCreateInfo *info,
                                                                    const struct XrApiLayerCreateInfo *apiLayerInfo,
                                                                    XrInstance *instance) {
    try {
        PFN_xrGetInstanceProcAddr next_get_instance_proc_addr = nullptr;
        PFN_xrCreateApiLayerInstance next_create_api_layer_instance = nullptr;
        XrApiLayerCreateInfo new_api_layer_info = {};
        bool first_time = !g_record_info.initialized;

        if (!g_record_info.initialized) {
            g_record_info.initialized = true;
            g_record_info.type = RECORD_TEXT_COUT;
        }

#if !defined(ANDROID)
        std::string export_type = PlatformUtilsGetEnv("XR_API_DUMP_EXPORT_TYPE");
        std::string file_name = PlatformUtilsGetEnv("XR_API_DUMP_FILE_NAME");
#else
        // We match the pattern used by the Vulkan api_dump layer here
        // (we replace the `XR_` prefix with `debug.` and make it lowercase.)
        // adb shell "setprop debug.api_dump_file_name '/sdcard/xr_apidump.txt'"
        std::string export_type = PlatformUtilsGetAndroidSystemProperty("debug.api_dump_export_type");
        std::string file_name = PlatformUtilsGetAndroidSystemProperty("debug.api_dump_file_name");
#endif

        if (!file_name.empty()) {
            g_record_info.file_name = file_name;
            g_record_info.type = RECORD_TEXT_FILE;
        }

        if (!export_type.empty()) {
            std::string export_type_lower = export_type;
            std::transform(export_type.begin(), export_type.end(), export_type_lower.begin(),
                           [](unsigned char c) { return std::tolower(c); });

            if (export_type_lower == "text") {
                if (!g_record_info.file_name.empty()) {
                    g_record_info.type = RECORD_TEXT_FILE;
                } else {
                    g_record_info.type = RECORD_TEXT_COUT;
                }
            } else if (export_type_lower == "html" && first_time) {
                g_record_info.type = RECORD_HTML_FILE;
                if (!ApiDumpLayerWriteHtmlHeader()) {
                    return XR_ERROR_INITIALIZATION_FAILED;
                }
            } else if (export_type_lower == "code") {
                g_record_info.type = RECORD_CODE_FILE;
            }
        }

        // Validate the API layer info and next API layer info structures before we try to use them
        if (nullptr == apiLayerInfo || XR_LOADER_INTERFACE_STRUCT_API_LAYER_CREATE_INFO != apiLayerInfo->structType ||
            XR_API_LAYER_CREATE_INFO_STRUCT_VERSION > apiLayerInfo->structVersion ||
            sizeof(XrApiLayerCreateInfo) > apiLayerInfo->structSize || nullptr == apiLayerInfo->nextInfo ||
            XR_LOADER_INTERFACE_STRUCT_API_LAYER_NEXT_INFO != apiLayerInfo->nextInfo->structType ||
            XR_API_LAYER_NEXT_INFO_STRUCT_VERSION > apiLayerInfo->nextInfo->structVersion ||
            sizeof(XrApiLayerNextInfo) > apiLayerInfo->nextInfo->structSize ||
            0 != strcmp("XR_APILAYER_LUNARG_api_dump", apiLayerInfo->nextInfo->layerName) ||
            nullptr == apiLayerInfo->nextInfo->nextGetInstanceProcAddr ||
            nullptr == apiLayerInfo->nextInfo->nextCreateApiLayerInstance) {
            return XR_ERROR_INITIALIZATION_FAILED;
        }

        // Generate output for this command as if it were the standard xrCreateInstance
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        contents.emplace_back("XrResult", "xrCreateInstance", "");
        contents.emplace_back("const XrInstanceCreateInfo*", "info", PointerToHexString(info));
        if (nullptr != info) {
            std::string info_prefix = "info->";
            contents.emplace_back("XrStructureType", "info->type", std::to_string(info->type));
            std::string next_prefix = info_prefix;
            next_prefix += "next";
            // Decode the next chain if it exists
            if (!ApiDumpDecodeNextChain(nullptr, info->next, next_prefix, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
            std::string flags_prefix = info_prefix;
            flags_prefix += "createFlags";
            contents.emplace_back("XrInstanceCreateFlags", flags_prefix, std::to_string(info->createFlags));
            std::string applicationinfo_prefix = info_prefix;
            applicationinfo_prefix += "applicationInfo";
            if (!ApiDumpOutputXrStruct(nullptr, &info->applicationInfo, applicationinfo_prefix, "XrApplicationInfo", true,
                                       contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
            std::string enabledapilayercount_prefix = info_prefix;
            enabledapilayercount_prefix += "enabledApiLayerCount";
            std::ostringstream oss_enabledApiLayerCount;
            oss_enabledApiLayerCount << "0x" << std::hex << (info->enabledApiLayerCount);
            contents.emplace_back("uint32_t", enabledapilayercount_prefix, oss_enabledApiLayerCount.str());
            std::string enabledapilayernames_prefix = info_prefix;
            enabledapilayernames_prefix += "enabledApiLayerNames";
            std::ostringstream oss_enabledApiLayerNames_array;
            oss_enabledApiLayerNames_array << "0x" << std::hex << (info->enabledApiLayerNames);
            contents.emplace_back("const char* const*", enabledapilayernames_prefix, oss_enabledApiLayerNames_array.str());
            for (uint32_t i = 0; i < info->enabledApiLayerCount; ++i) {
                std::string prefix = enabledapilayernames_prefix + "[" + std::to_string(i) + "]";
                contents.emplace_back("const char* const*", prefix, info->enabledApiLayerNames[i]);
            }
            std::string enabledextensioncount_prefix = info_prefix;
            enabledextensioncount_prefix += "enabledExtensionCount";
            std::ostringstream oss_enabledExtensionCount;
            oss_enabledExtensionCount << "0x" << std::hex << (info->enabledExtensionCount);
            contents.emplace_back("uint32_t", enabledextensioncount_prefix, oss_enabledExtensionCount.str());
            std::string enabledextensionnames_prefix = info_prefix;
            enabledextensionnames_prefix += "enabledExtensionNames";
            std::ostringstream oss_enabledExtensionNames_array;
            oss_enabledExtensionNames_array << "0x" << std::hex << (info->enabledExtensionNames);
            contents.emplace_back("const char* const*", enabledextensionnames_prefix, oss_enabledExtensionNames_array.str());
            for (uint32_t ii = 0; ii < info->enabledExtensionCount; ++ii) {
                std::string prefix = enabledextensionnames_prefix + "[" + std::to_string(ii) + "]";
                contents.emplace_back("const char* const*", prefix, info->enabledExtensionNames[ii]);
            }
        }

        contents.emplace_back("XrInstance*", "instance", PointerToHexString(instance));
        ApiDumpLayerRecordContent(contents);

        // Copy the contents of the layer info struct, but then move the next info up by
        // one slot so that the next layer gets information.
        memcpy(&new_api_layer_info, apiLayerInfo, sizeof(XrApiLayerCreateInfo));
        new_api_layer_info.nextInfo = apiLayerInfo->nextInfo->next;

        // Get the function pointers we need
        next_get_instance_proc_addr = apiLayerInfo->nextInfo->nextGetInstanceProcAddr;
        next_create_api_layer_instance = apiLayerInfo->nextInfo->nextCreateApiLayerInstance;

        // Create the instance
        XrInstance returned_instance = *instance;
        XrResult result = next_create_api_layer_instance(info, &new_api_layer_info, &returned_instance);
        *instance = returned_instance;

        // Create the dispatch table to the next levels
        auto *next_dispatch = new XrGeneratedDispatchTable();
        GeneratedXrPopulateDispatchTable(next_dispatch, returned_instance, next_get_instance_proc_addr);

        std::unique_lock<std::mutex> mlock(g_instance_dispatch_mutex);
        g_instance_dispatch_map[returned_instance] = next_dispatch;

        return result;
    } catch (...) {
        return XR_ERROR_INITIALIZATION_FAILED;
    }
}